

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

PointerReader * __thiscall
capnp::_::StructReader::getPointerField
          (PointerReader *__return_storage_ptr__,StructReader *this,StructPointerOffset ptrIndex)

{
  StructPointerOffset ptrIndex_local;
  StructReader *this_local;
  
  if (ptrIndex < this->pointerCount) {
    PointerReader::PointerReader
              (__return_storage_ptr__,this->segment,this->capTable,this->pointers + ptrIndex,
               this->nestingLimit);
  }
  else {
    PointerReader::PointerReader(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline PointerReader StructReader::getPointerField(StructPointerOffset ptrIndex) const {
  if (ptrIndex < pointerCount) {
    // Hacky because WirePointer is defined in the .c++ file (so is incomplete here).
    return PointerReader(segment, capTable, reinterpret_cast<const WirePointer*>(
        reinterpret_cast<const word*>(pointers) + ptrIndex * WORDS_PER_POINTER), nestingLimit);
  } else{
    return PointerReader();
  }
}